

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O1

b_tree_node * __thiscall
b_tree::_copy_arm(b_tree_node *__return_storage_ptr__,b_tree *this,int64_t key,int64_t node_ofs)

{
  ushort uVar1;
  void *__dest;
  size_t __n;
  runtime_error *prVar2;
  uint uVar3;
  ulong uVar4;
  b_tree_node current_node;
  b_tree_node child_node;
  b_tree_node bStack_f8;
  b_tree_node local_90;
  
  b_tree_node::b_tree_node(&bStack_f8,&this->_p,node_ofs);
  b_tree_node::b_tree_node
            (__return_storage_ptr__,&this->_p,*bStack_f8._min_degree_field,
             *bStack_f8._leaf_field != 0);
  printf("%ld ",__return_storage_ptr__->_ofs_field);
  __dest = (__return_storage_ptr__->_mm)._mem;
  if (__dest == (void *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Unable to map default constructed memory map.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (bStack_f8._mm._mem == (void *)0x0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"Unable to map default constructed memory map.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __n = pager::block_size();
  memcpy(__dest,bStack_f8._mm._mem,__n);
  uVar1 = *bStack_f8._num_keys_field;
  uVar4 = 0;
  if (uVar1 != 0) {
    do {
      if (key <= bStack_f8._keys_field[uVar4 & 0xffff]) goto LAB_00107bf9;
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while (uVar1 != uVar3);
    uVar4 = (ulong)(uint)uVar1;
LAB_00107bf9:
    uVar4 = uVar4 & 0xffff;
  }
  if (*bStack_f8._leaf_field == 0) {
    _copy_arm(&local_90,this,key,bStack_f8._child_ofs_field[uVar4]);
    __return_storage_ptr__->_child_ofs_field[uVar4] = local_90._ofs_field;
    r_memory_map::~r_memory_map(&local_90._mm);
  }
  r_memory_map::~r_memory_map(&bStack_f8._mm);
  return __return_storage_ptr__;
}

Assistant:

b_tree_node b_tree::_copy_arm(int64_t key, int64_t node_ofs)
{
    b_tree_node current_node(_p, node_ofs);
    b_tree_node new_node(_p, current_node._min_degree(), current_node._leaf());

    printf("%ld ", new_node._ofs());

    // Copy keys, values, and valid flags from the current node to the new node
    memcpy(new_node._mm.map().first, current_node._mm.map().first, _p.block_size());

    int i = 0;
    while (i < current_node._num_keys() && key > current_node._key(i))
        i++;

    // If the current node is a leaf, return the new node
    if (current_node._leaf())
        return new_node;

    // If the current node is an internal node, recursively copy the child arm
    b_tree_node child_node = _copy_arm(key, current_node._child_ofs(i));

    // Update the child offset in the new node to point to the copied child arm
    new_node._set_child_ofs(i, child_node._ofs());

    return new_node;
}